

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.h
# Opt level: O0

int __thiscall tinyxml2::XMLElement::IntAttribute(XMLElement *this,char *name)

{
  int local_1c;
  char *pcStack_18;
  int i;
  char *name_local;
  XMLElement *this_local;
  
  local_1c = 0;
  pcStack_18 = name;
  name_local = (char *)this;
  QueryIntAttribute(this,name,&local_1c);
  return local_1c;
}

Assistant:

int		 IntAttribute( const char* name ) const		{
        int i=0;
        QueryIntAttribute( name, &i );
        return i;
    }